

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPLastprivateClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPLastprivateClause *this)

{
  ulong uVar1;
  string local_78;
  OpenMPLastprivateClauseModifier local_58;
  allocator<char> local_51;
  OpenMPLastprivateClauseModifier modifier;
  string clause_string;
  allocator<char> local_1a;
  byte local_19;
  OpenMPLastprivateClause *local_18;
  OpenMPLastprivateClause *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (OpenMPLastprivateClause *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"lastprivate ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&modifier,"(",&local_51);
  std::allocator<char>::~allocator(&local_51);
  local_58 = getModifier(this);
  if (local_58 == OMPC_LASTPRIVATE_MODIFIER_conditional) {
    std::__cxx11::string::operator+=((string *)&modifier,"conditional");
  }
  uVar1 = std::__cxx11::string::size();
  if (1 < uVar1) {
    std::__cxx11::string::operator+=((string *)&modifier,": ");
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_78,&this->super_OpenMPClause);
  std::__cxx11::string::operator+=((string *)&modifier,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::operator+=((string *)&modifier,") ");
  uVar1 = std::__cxx11::string::size();
  if (2 < uVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&modifier);
  }
  local_19 = 1;
  std::__cxx11::string::~string((string *)&modifier);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPLastprivateClause::toString() {

    std::string result = "lastprivate ";
    std::string clause_string = "(";
    OpenMPLastprivateClauseModifier modifier = this->getModifier();
    switch (modifier) {
        case OMPC_LASTPRIVATE_MODIFIER_conditional:
            clause_string += "conditional";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += ": ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 2) {
        result += clause_string;
    };

    return result;
}